

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *
wasm::WATParser::params<wasm::WATParser::ParseImplicitTypeDefsCtx>
          (MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>
           *__return_storage_ptr__,ParseImplicitTypeDefsCtx *ctx,bool allowNames)

{
  Lexer *this;
  bool *this_00;
  size_t pos;
  Name id_00;
  bool bVar1;
  bool bVar2;
  string_view expected;
  string local_120;
  string local_100;
  undefined1 local_e0 [8];
  optional<wasm::Name> id;
  Result<wasm::Type> type;
  undefined1 local_80 [8];
  Result<wasm::Type> _val;
  ParamsT res;
  
  _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
  super__Move_assign_alias<wasm::Type,_wasm::Err>.super__Copy_assign_alias<wasm::Type,_wasm::Err>.
  super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
  super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_index = '\0';
  _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
  super__Move_assign_alias<wasm::Type,_wasm::Err>.super__Copy_assign_alias<wasm::Type,_wasm::Err>.
  super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
  super__Variant_storage_alias<wasm::Type,_wasm::Err>._33_7_ = 0;
  this = &ctx->in;
  bVar2 = false;
  this_00 = &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._M_engaged;
  do {
    expected._M_str = "param";
    expected._M_len = 5;
    bVar1 = Lexer::takeSExprStart(this,expected);
    if (!bVar1) {
      if (bVar2) {
        *(undefined8 *)
         &(__return_storage_ptr__->val).
          super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
          .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> =
             _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
             super__Move_assign_alias<wasm::Type,_wasm::Err>.
             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
             super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> +
         8) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> +
         0x10) = 0;
        _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_index = '\0';
        _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._33_7_ = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> +
         0x20) = '\0';
      }
      else {
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> +
         0x20) = '\x01';
      }
LAB_00c36fd8:
      std::_Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>::~_Vector_base
                ((_Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_> *)
                 ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
      return __return_storage_ptr__;
    }
    pos = this->pos;
    Lexer::takeID((optional<wasm::Name> *)local_e0,this);
    if (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._8_1_ != '\0') {
      if (allowNames) {
        valtype<wasm::WATParser::ParseImplicitTypeDefsCtx>((Result<wasm::Type> *)this_00,ctx);
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::Err>::_Copy_ctor_base
                  ((_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_80,
                   (_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)this_00);
        if (_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x01') {
          std::__cxx11::string::string
                    ((string *)
                     ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),
                     (string *)local_80);
          std::__detail::__variant::
          _Variant_storage<false,std::vector<wasm::NameType,std::allocator<wasm::NameType>>,wasm::None,wasm::Err>
          ::_Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,std::vector<wasm::NameType,std::allocator<wasm::NameType>>,wasm::None,wasm::Err>
                      *)__return_storage_ptr__,
                     (__index_type *)
                     ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
LAB_00c36fb7:
          std::__cxx11::string::~string
                    ((string *)
                     ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
          std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_80);
        }
        else {
          std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_80);
          bVar2 = Lexer::takeRParen(this);
          if (bVar2) {
            id_00.super_IString.str._M_str =
                 (char *)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.
                         str._M_len;
            id_00.super_IString.str._M_len = (size_t)local_e0;
            TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::appendParam
                      (&ctx->super_TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>,
                       (ParamsT *)
                       ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                               super__Move_assign_alias<wasm::Type,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),id_00,
                       (TypeT)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                              super__Optional_payload_base<wasm::Name>._16_8_);
            std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::Err> *)this_00);
            goto LAB_00c36f3e;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_100,"expected end of param",
                     (allocator<char> *)
                     ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
          Lexer::err((Err *)local_80,this,&local_100);
          std::__detail::__variant::
          _Variant_storage<false,std::vector<wasm::NameType,std::allocator<wasm::NameType>>,wasm::None,wasm::Err>
          ::_Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,std::vector<wasm::NameType,std::allocator<wasm::NameType>>,wasm::None,wasm::Err>
                      *)__return_storage_ptr__,local_80);
          std::__cxx11::string::~string((string *)local_80);
          std::__cxx11::string::~string((string *)&local_100);
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)
                   &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,"unexpected named parameter",(allocator<char> *)local_80);
        Lexer::err((Err *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::Name>._M_engaged,this,pos,&local_120);
        std::__detail::__variant::
        _Variant_storage<false,std::vector<wasm::NameType,std::allocator<wasm::NameType>>,wasm::None,wasm::Err>
        ::_Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,std::vector<wasm::NameType,std::allocator<wasm::NameType>>,wasm::None,wasm::Err>
                    *)__return_storage_ptr__,
                   &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged);
        std::__cxx11::string::~string
                  ((string *)
                   &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged);
        std::__cxx11::string::~string((string *)&local_120);
      }
      goto LAB_00c36fd8;
    }
    while( true ) {
      bVar2 = Lexer::takeRParen(this);
      if (bVar2) break;
      valtype<wasm::WATParser::ParseImplicitTypeDefsCtx>((Result<wasm::Type> *)this_00,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_80,
                 (_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)this_00);
      if (_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),(string *)local_80)
        ;
        std::__detail::__variant::
        _Variant_storage<false,std::vector<wasm::NameType,std::allocator<wasm::NameType>>,wasm::None,wasm::Err>
        ::_Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,std::vector<wasm::NameType,std::allocator<wasm::NameType>>,wasm::None,wasm::Err>
                    *)__return_storage_ptr__,
                   (__index_type *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        goto LAB_00c36fb7;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_80);
      TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::appendParam
                (&ctx->super_TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>,
                 (ParamsT *)
                 ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),(Name)ZEXT816(0),
                 (TypeT)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>._16_8_);
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)this_00);
    }
LAB_00c36f3e:
    bVar2 = true;
  } while( true );
}

Assistant:

MaybeResult<typename Ctx::ParamsT> params(Ctx& ctx, bool allowNames) {
  bool hasAny = false;
  auto res = ctx.makeParams();
  while (ctx.in.takeSExprStart("param"sv)) {
    hasAny = true;
    auto pos = ctx.in.getPos();
    if (auto id = ctx.in.takeID()) {
      // Single named param
      if (!allowNames) {
        return ctx.in.err(pos, "unexpected named parameter");
      }
      auto type = valtype(ctx);
      CHECK_ERR(type);
      if (!ctx.in.takeRParen()) {
        return ctx.in.err("expected end of param");
      }
      ctx.appendParam(res, *id, *type);
    } else {
      // Repeated unnamed params
      while (!ctx.in.takeRParen()) {
        auto type = valtype(ctx);
        CHECK_ERR(type);
        ctx.appendParam(res, {}, *type);
      }
    }
  }
  if (hasAny) {
    return res;
  }
  return {};
}